

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeFreeOpArray(sqlite3 *db,Op *aOp,int nOp)

{
  int in_EDX;
  sqlite3 *in_RSI;
  Op *pOp;
  sqlite3 *p4;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RSI != (sqlite3 *)0x0) {
    p4 = (sqlite3 *)(&in_RSI->pVfs + (long)(in_EDX + -1) * 3);
    while( true ) {
      if (*(char *)((long)&p4->pVfs + 1) < -5) {
        freeP4(in_RSI,in_EDX,p4);
      }
      if (p4 == in_RSI) break;
      p4 = (sqlite3 *)&p4[-1].nDeferredImmCons;
    }
    sqlite3DbNNFreeNN(in_RSI,(void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

static void vdbeFreeOpArray(sqlite3 *db, Op *aOp, int nOp){
  assert( nOp>=0 );
  assert( db!=0 );
  if( aOp ){
    Op *pOp = &aOp[nOp-1];
    while(1){  /* Exit via break */
      if( pOp->p4type <= P4_FREE_IF_LE ) freeP4(db, pOp->p4type, pOp->p4.p);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
      sqlite3DbFree(db, pOp->zComment);
#endif
      if( pOp==aOp ) break;
      pOp--;
    }
    sqlite3DbNNFreeNN(db, aOp);
  }
}